

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_> *
BoxNesting::Parser::getBoxes
          (vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_> *__return_storage_ptr__,
          istream *inputStream)

{
  int iVar1;
  _func_int **__nptr;
  char cVar2;
  int *piVar3;
  ulong uVar4;
  ostream *poVar5;
  runtime_error *this;
  ulong unaff_R15;
  string inputLine;
  stringstream ss;
  string local_1f8 [32];
  _func_int **local_1d8;
  undefined8 local_1d0;
  char local_1c8;
  undefined7 uStack_1c7;
  undefined1 local_1b8 [392];
  
  local_1d8 = (_func_int **)&local_1c8;
  local_1d0 = 0;
  local_1c8 = '\0';
  cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)inputStream + -0x18) + (char)inputStream);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            (inputStream,(string *)&local_1d8,cVar2);
  __nptr = local_1d8;
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  *piVar3 = 0;
  uVar4 = strtol((char *)__nptr,(char **)local_1b8,10);
  if ((_func_int **)local_1b8._0_8_ == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else {
    unaff_R15 = uVar4;
    if (((long)(int)uVar4 == uVar4) && (*piVar3 != 0x22)) {
      if (*piVar3 == 0) {
        *piVar3 = iVar1;
      }
      if (0xffffec77 < (int)uVar4 - 0x1389U) {
        uVar4 = uVar4 & 0xffffffff;
        (__return_storage_ptr__->
        super__Vector_base<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>::reserve
                  (__return_storage_ptr__,uVar4);
        if (uVar4 != 0) {
          do {
            parseBoxSpecification((Box *)local_1b8,inputStream);
            std::vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>::
            emplace_back<BoxNesting::Box>(__return_storage_ptr__,(Box *)local_1b8);
            uVar4 = uVar4 - 1;
          } while (uVar4 != 0);
        }
        if (local_1d8 != (_func_int **)&local_1c8) {
          operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
        }
        return __return_storage_ptr__;
      }
      goto LAB_00105ad9;
    }
  }
  std::__throw_out_of_range("stoi");
LAB_00105ad9:
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b8 + 0x10),
             "Amount of boxes is smaller then 1 or too large, max allowed: ",0x3d);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)(local_1b8 + 0x10),5000);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,". Got: \"",8);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)unaff_R15);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
  this = (runtime_error *)__cxa_allocate_exception(0x18);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_1f8);
  *(undefined ***)this = &PTR__ParserError_0011fab8;
  *(undefined8 *)(this + 0x10) = 0;
  __cxa_throw(this,&ParserError::typeinfo,ParserError::~ParserError);
}

Assistant:

std::vector<Box> Parser::getBoxes(std::istream& inputStream)
{
	std::string inputLine;
	std::getline(inputStream, inputLine);

	int16_t boxCount = 0;
	static const auto max = 5000;
	try {
		auto tmp = std::stoi(inputLine);
		if (tmp <= 0 || tmp > max) {
			std::stringstream ss;
			ss << "Amount of boxes is smaller then 1 or too large, max allowed: " << max << ". Got: \"" << tmp << "\"";
			throw ParserError(ss.str());
		}
		boxCount = static_cast<int16_t>(tmp);
	} catch (const std::invalid_argument& e) {
		std::stringstream ss;
		ss << "Expected number to indicate amount of boxes to take from input. Got: \"" << inputLine << "\"";
		throw ParserError(ss.str(), e);
	} catch (const std::out_of_range& e) {
		std::stringstream ss;
		ss << "Number of boxes is too large to handle for this program, max allowed: " << max;
		throw ParserError(ss.str(), e);
	}

	std::vector<Box> boxes;
	boxes.reserve(boxCount);
	for (std::size_t i = 0; i < boxCount; ++i) {
		boxes.emplace_back(parseBoxSpecification(inputStream));
	}

	return boxes;
}